

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O0

ksymbol_t KHashMap_getcode(KonohaContext *kctx,KHashMap *kmp,kArray *list,char *name,size_t len,
                          uintptr_t hcode,int spol,ksymbol_t def)

{
  int iVar1;
  long *hcode_00;
  char *__s1;
  kString *StringKey;
  uintptr_t unboxValue;
  char *in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  KonohaContext *in_R8;
  KHashMap *in_R9;
  kString *stringKey;
  uintptr_t sym;
  KHashMapEntry *e;
  ksymbol_t local_4;
  
  hcode_00 = (long *)(**(code **)(*(long *)(in_RDI + 0x18) + 200))(in_RDI,in_RSI,in_R9);
  do {
    if (hcode_00 == (long *)0x0) {
      if ((ksymbol_t)sym == 0xfffffffe) {
        StringKey = (kString *)(*(ulong *)(in_RDX + 0x18) >> 3);
        unboxValue = (**(code **)(*(long *)(in_RDI + 0x18) + 0x1d0))
                               (in_RDI,in_RDX,in_RCX,in_R8,stringKey._0_4_);
        KHashMap_AddStringUnboxValue(in_R8,in_R9,(uintptr_t)hcode_00,StringKey,unboxValue);
        local_4 = (ksymbol_t)StringKey;
      }
      else {
        local_4 = (ksymbol_t)sym;
      }
      return local_4;
    }
    if (((KHashMap *)*hcode_00 == in_R9) && (in_R8 == *(KonohaContext **)(hcode_00[2] + 0x18))) {
      __s1 = (char *)(**(code **)(*(long *)(hcode_00[2] + 8) + 0x20))(in_RDI,hcode_00[2]);
      iVar1 = strncmp(__s1,in_RCX,(size_t)in_R8);
      if (iVar1 == 0) {
        return (ksymbol_t)hcode_00[3];
      }
    }
    hcode_00 = (long *)hcode_00[1];
  } while( true );
}

Assistant:

static ksymbol_t KHashMap_getcode(KonohaContext *kctx, KHashMap *kmp, kArray *list, const char *name, size_t len, uintptr_t hcode, int spol, ksymbol_t def)
{
	KHashMapEntry *e = KLIB KHashMap_get(kctx, kmp, hcode);
	while(e != NULL) {
		if(e->hcode == hcode && len == kString_size(e->StringKey) && strncmp(kString_text(e->StringKey), name, len) == 0) {
			return (ksymbol_t)e->unboxValue;
		}
		e = e->next;
	}
	if(def == KSymbol_NewId) {
		uintptr_t sym = kArray_size(list);
		kString *stringKey = KLIB new_kString(kctx, list, name, len, spol);
		KHashMap_AddStringUnboxValue(kctx, kmp, hcode, stringKey, sym);
		return (ksymbol_t)sym;
	}
	return def;
}